

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snr.cc
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  reference pvVar6;
  ostream *poVar7;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_11;
  ostringstream error_message_10;
  double segmental_snr_of_current_frame;
  ostringstream error_message_9;
  ostringstream error_message_8;
  double noise_1;
  int i;
  double segmental_noise_power;
  double segmental_signal_power;
  int frame_index;
  double segmental_snr;
  vector<double,_std::allocator<double>_> signal_plus_noise_1;
  vector<double,_std::allocator<double>_> signal_1;
  ostringstream error_message_7;
  double snr;
  ostringstream error_message_6;
  ostringstream error_message_5;
  double noise;
  double noise_power;
  double signal_power;
  double signal_plus_noise;
  double signal;
  istream *stream_for_signal_plus_noise;
  ostringstream error_message_4;
  ifstream ifs2;
  istream *stream_for_signal;
  ostringstream error_message_3;
  ifstream ifs1;
  ostringstream error_message_2;
  int num_input_files;
  char *signal_plus_noise_file;
  char *signal_file;
  ostringstream error_message_1;
  int tmp;
  int max;
  int min;
  ostringstream error_message;
  int option_char;
  OutputType output_type;
  int frame_length;
  option *in_stack_ffffffffffffe568;
  double data_to_write;
  istream *in_stack_ffffffffffffe570;
  string *in_stack_ffffffffffffe578;
  allocator *paVar8;
  undefined4 in_stack_ffffffffffffe580;
  int in_stack_ffffffffffffe584;
  size_type in_stack_ffffffffffffe588;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe590;
  istream *in_stack_ffffffffffffe5a8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe5b0;
  undefined8 in_stack_ffffffffffffe5b8;
  undefined8 in_stack_ffffffffffffe5c0;
  int *in_stack_ffffffffffffe5d0;
  bool local_1a12;
  bool local_19ca;
  char *local_19c8;
  byte local_1922;
  allocator local_18e1;
  string local_18e0 [32];
  ostringstream local_18c0 [24];
  ostringstream *in_stack_ffffffffffffe758;
  string *in_stack_ffffffffffffe760;
  allocator local_1741;
  string local_1740 [32];
  ostringstream local_1720 [376];
  double local_15a8;
  allocator local_1599;
  string local_1598 [32];
  ostringstream local_1578 [383];
  allocator local_13f9;
  string local_13f8 [32];
  ostringstream local_13d8 [376];
  double local_1260;
  int local_1254;
  double local_1250;
  double local_1248;
  int local_123c;
  double local_1238;
  vector<double,_std::allocator<double>_> local_1228;
  vector<double,_std::allocator<double>_> local_1208;
  allocator local_11e9;
  string local_11e8 [32];
  ostringstream local_11c8 [376];
  double local_1050;
  allocator local_1041;
  string local_1040 [32];
  ostringstream local_1020 [383];
  allocator local_ea1;
  string local_ea0 [32];
  ostringstream local_e80 [376];
  double local_d08;
  double local_d00;
  double local_cf8;
  double local_cf0;
  double local_ce8;
  char *local_ce0;
  allocator local_cd1;
  string local_cd0 [32];
  ostringstream local_cb0 [376];
  char local_b38 [520];
  char *local_930;
  int local_928;
  allocator local_921;
  string local_920 [32];
  ostringstream local_900 [376];
  char local_788 [527];
  allocator local_579;
  string local_578 [32];
  ostringstream local_558 [380];
  int local_3dc;
  char *local_3d8;
  char *local_3d0;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [32];
  int local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x100;
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_1c = ya_getopt_long(in_stack_ffffffffffffe584,(char **)in_stack_ffffffffffffe578,
                                   (char *)in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,
                                   (int *)0x1036ca), pcVar2 = ya_optarg, local_1c != -1) {
    if (local_1c == 0x68) {
      anon_unknown.dwarf_1b2d::PrintUsage
                ((ostream *)CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580));
      return 0;
    }
    if (local_1c == 0x6c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar2,&local_41);
      bVar3 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe578,(int *)in_stack_ffffffffffffe570);
      bVar5 = local_14 < 1;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (!bVar3 || bVar5) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"snr",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
    }
    else {
      if (local_1c != 0x6f) {
        anon_unknown.dwarf_1b2d::PrintUsage
                  ((ostream *)CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580));
        return 1;
      }
      local_1f8 = 0;
      local_1fc = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar2,&local_221);
      bVar5 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe578,(int *)in_stack_ffffffffffffe570);
      local_1922 = 1;
      if (bVar5) {
        bVar5 = sptk::IsInRange(local_200,0,2);
        local_1922 = bVar5 ^ 0xff;
      }
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if ((local_1922 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        poVar7 = std::operator<<((ostream *)local_3a0,
                                 "The argument for the -o option must be an integer ");
        poVar7 = std::operator<<(poVar7,"in the range of ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
        poVar7 = std::operator<<(poVar7," to ");
        std::ostream::operator<<(poVar7,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"snr",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
      local_18 = local_200;
    }
  }
  local_3dc = local_8 - ya_optind;
  if (local_3dc == 2) {
    local_3d0 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_3d8 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_3dc != 1) {
      std::__cxx11::ostringstream::ostringstream(local_558);
      std::operator<<((ostream *)local_558,"Just two input files, file1 and infile, are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_578,"snr",&local_579);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
      std::__cxx11::string::~string(local_578);
      std::allocator<char>::~allocator((allocator<char> *)&local_579);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_558);
      return local_4;
    }
    local_3d0 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_3d8 = (char *)0x0;
  }
  std::ifstream::ifstream(local_788);
  pcVar2 = local_3d0;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_788,(_Ios_Openmode)pcVar2);
  bVar4 = std::ios::fail();
  if ((bVar4 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_900);
    poVar7 = std::operator<<((ostream *)local_900,"Cannot open file ");
    std::operator<<(poVar7,local_3d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_920,"snr",&local_921);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
    std::__cxx11::string::~string(local_920);
    std::allocator<char>::~allocator((allocator<char> *)&local_921);
    local_4 = 1;
    local_928 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_900);
    goto LAB_001050ff;
  }
  local_930 = local_788;
  std::ifstream::ifstream(local_b38);
  pcVar2 = local_3d8;
  if (local_3d8 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_b38,(_Ios_Openmode)pcVar2);
    bVar4 = std::ios::fail();
    if ((bVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_cb0);
      poVar7 = std::operator<<((ostream *)local_cb0,"Cannot open file ");
      std::operator<<(poVar7,local_3d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cd0,"snr",&local_cd1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
      std::__cxx11::string::~string(local_cd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
      local_4 = 1;
      local_928 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_cb0);
      goto LAB_001050e1;
    }
  }
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) == 0) {
    local_19c8 = (char *)&std::cin;
  }
  else {
    local_19c8 = local_b38;
  }
  local_ce0 = local_19c8;
  if (local_18 != 0) {
    if ((local_18 == 1) || (local_18 == 2)) {
      std::allocator<double>::allocator((allocator<double> *)0x104792);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580));
      std::allocator<double>::~allocator((allocator<double> *)0x1047be);
      std::allocator<double>::allocator((allocator<double> *)0x1047e3);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580));
      std::allocator<double>::~allocator((allocator<double> *)0x10480f);
      local_1238 = 0.0;
      local_123c = 0;
      do {
        data_to_write = 0.0;
        bVar5 = sptk::ReadStream<double>
                          (SUB81((ulong)in_stack_ffffffffffffe5c0 >> 0x30,0),
                           (int)in_stack_ffffffffffffe5c0,
                           (int)((ulong)in_stack_ffffffffffffe5b8 >> 0x20),
                           (int)in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0,
                           in_stack_ffffffffffffe5a8,in_stack_ffffffffffffe5d0);
        local_1a12 = false;
        if (bVar5) {
          data_to_write = 0.0;
          local_1a12 = sptk::ReadStream<double>
                                 (SUB81((ulong)in_stack_ffffffffffffe5c0 >> 0x30,0),
                                  (int)in_stack_ffffffffffffe5c0,
                                  (int)((ulong)in_stack_ffffffffffffe5b8 >> 0x20),
                                  (int)in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0,
                                  in_stack_ffffffffffffe5a8,in_stack_ffffffffffffe5d0);
        }
        if (local_1a12 == false) {
          if ((local_18 == 1) && (0 < local_123c)) {
            local_1238 = local_1238 / (double)local_123c;
            bVar5 = sptk::WriteStream<double>(data_to_write,(ostream *)0x104f52);
            in_stack_ffffffffffffe584 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffe584);
            if (!bVar5) {
              std::__cxx11::ostringstream::ostringstream(local_18c0);
              std::operator<<((ostream *)local_18c0,"Failed to write segmental SNR");
              paVar8 = &local_18e1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_18e0,"snr",paVar8);
              sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
              std::__cxx11::string::~string(local_18e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_18e1);
              local_4 = 1;
              local_928 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_18c0);
              goto LAB_00105084;
            }
          }
          local_928 = 0;
          goto LAB_00105084;
        }
        local_1248 = 0.0;
        local_1250 = 0.0;
        for (local_1254 = 0; local_1254 < local_14; local_1254 = local_1254 + 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1208,(long)local_1254);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1208,(long)local_1254);
          local_1248 = dVar1 * *pvVar6 + local_1248;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1228,(long)local_1254);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1208,(long)local_1254);
          local_1260 = dVar1 - *pvVar6;
          local_1250 = local_1260 * local_1260 + local_1250;
        }
        if ((local_1248 == 0.0) && (!NAN(local_1248))) {
          std::__cxx11::ostringstream::ostringstream(local_13d8);
          poVar7 = std::operator<<((ostream *)local_13d8,"The signal power of ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_123c);
          std::operator<<(poVar7,"th frame is 0.0");
          paVar8 = &local_13f9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_13f8,"snr",paVar8);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
          std::__cxx11::string::~string(local_13f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
          local_4 = 1;
          local_928 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_13d8);
          goto LAB_00105084;
        }
        if ((local_1250 == 0.0) && (!NAN(local_1250))) {
          std::__cxx11::ostringstream::ostringstream(local_1578);
          poVar7 = std::operator<<((ostream *)local_1578,"The noise power of ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_123c);
          std::operator<<(poVar7,"th frame is 0.0");
          paVar8 = &local_1599;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1598,"snr",paVar8);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
          std::__cxx11::string::~string(local_1598);
          std::allocator<char>::~allocator((allocator<char> *)&local_1599);
          local_4 = 1;
          local_928 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1578);
          goto LAB_00105084;
        }
        local_15a8 = log10(local_1248 / local_1250);
        local_15a8 = local_15a8 * 10.0;
        if (local_18 == 1) {
          local_1238 = local_15a8 + local_1238;
        }
        else if ((local_18 == 2) &&
                (bVar5 = sptk::WriteStream<double>(data_to_write,(ostream *)0x104d86), !bVar5))
        goto LAB_00104d9a;
        local_123c = local_123c + 1;
      } while( true );
    }
    goto LAB_001050cb;
  }
  local_cf8 = 0.0;
  local_d00 = 0.0;
  while( true ) {
    bVar5 = sptk::ReadStream<double>((double *)in_stack_ffffffffffffe578,in_stack_ffffffffffffe570);
    local_19ca = false;
    if (bVar5) {
      local_19ca = sptk::ReadStream<double>
                             ((double *)in_stack_ffffffffffffe578,in_stack_ffffffffffffe570);
    }
    if (local_19ca == false) break;
    local_cf8 = local_ce8 * local_ce8 + local_cf8;
    local_d08 = local_cf0 - local_ce8;
    local_d00 = local_d08 * local_d08 + local_d00;
  }
  if ((local_cf8 != 0.0) || (NAN(local_cf8))) {
    if ((local_d00 != 0.0) || (NAN(local_d00))) {
      local_1050 = log10(local_cf8 / local_d00);
      local_1050 = local_1050 * 10.0;
      bVar5 = sptk::WriteStream<double>((double)in_stack_ffffffffffffe568,(ostream *)0x104611);
      if (bVar5) goto LAB_001050cb;
      std::__cxx11::ostringstream::ostringstream(local_11c8);
      std::operator<<((ostream *)local_11c8,"Failed to write SNR");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_11e8,"snr",&local_11e9);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
      std::__cxx11::string::~string(local_11e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
      local_4 = 1;
      local_928 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_11c8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1020);
      std::operator<<((ostream *)local_1020,"The noise power is 0.0");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1040,"snr",&local_1041);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
      std::__cxx11::string::~string(local_1040);
      std::allocator<char>::~allocator((allocator<char> *)&local_1041);
      local_4 = 1;
      local_928 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1020);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e80);
    std::operator<<((ostream *)local_e80,"The signal power is 0.0");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ea0,"snr",&local_ea1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
    std::__cxx11::string::~string(local_ea0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
    local_4 = 1;
    local_928 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e80);
  }
  goto LAB_001050e1;
LAB_00104d9a:
  std::__cxx11::ostringstream::ostringstream(local_1720);
  poVar7 = std::operator<<((ostream *)local_1720,"Failed to write segmental SNR of ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_123c);
  std::operator<<(poVar7,"th frame");
  paVar8 = &local_1741;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1740,"snr",paVar8);
  sptk::PrintErrorMessage(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  std::__cxx11::string::~string(local_1740);
  std::allocator<char>::~allocator((allocator<char> *)&local_1741);
  local_4 = 1;
  local_928 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_1720);
LAB_00105084:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580));
  if (local_928 == 0) {
LAB_001050cb:
    local_4 = 0;
    local_928 = 1;
  }
LAB_001050e1:
  std::ifstream::~ifstream(local_b38);
LAB_001050ff:
  std::ifstream::~ifstream(local_788);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_length(kDefaultFrameLength);
  OutputType output_type(kDefaultOutputType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_length) ||
            frame_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(OutputType::kNumOutputTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        output_type = static_cast<OutputType>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* signal_file;
  const char* signal_plus_noise_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    signal_file = argv[argc - 2];
    signal_plus_noise_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    signal_file = argv[argc - 1];
    signal_plus_noise_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }

  // Open stream for reading signal sequence.
  std::ifstream ifs1;
  ifs1.open(signal_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << signal_file;
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }
  std::istream& stream_for_signal(ifs1);

  // Open stream for reading signal plus noise sequence.
  std::ifstream ifs2;
  if (NULL != signal_plus_noise_file) {
    ifs2.open(signal_plus_noise_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << signal_plus_noise_file;
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  }
  std::istream& stream_for_signal_plus_noise(ifs2.is_open() ? ifs2 : std::cin);

  if (OutputType::kSnr == output_type) {
    double signal;
    double signal_plus_noise;
    double signal_power(0.0);
    double noise_power(0.0);
    while (
        sptk::ReadStream(&signal, &stream_for_signal) &&
        sptk::ReadStream(&signal_plus_noise, &stream_for_signal_plus_noise)) {
      signal_power += signal * signal;

      const double noise(signal_plus_noise - signal);
      noise_power += noise * noise;
    }

    if (0.0 == signal_power) {
      std::ostringstream error_message;
      error_message << "The signal power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
    if (0.0 == noise_power) {
      std::ostringstream error_message;
      error_message << "The noise power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }

    const double snr(10.0 * std::log10(signal_power / noise_power));
    if (!sptk::WriteStream(snr, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write SNR";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  } else if (OutputType::kSegmentalSnr == output_type ||
             OutputType::kSegmentalSnrPerFrame == output_type) {
    std::vector<double> signal(frame_length);
    std::vector<double> signal_plus_noise(frame_length);
    double segmental_snr(0.0);
    int frame_index(0);
    for (; sptk::ReadStream(false, 0, 0, frame_length, &signal,
                            &stream_for_signal, NULL) &&
           sptk::ReadStream(false, 0, 0, frame_length, &signal_plus_noise,
                            &stream_for_signal_plus_noise, NULL);
         ++frame_index) {
      double segmental_signal_power(0.0);
      double segmental_noise_power(0.0);

      for (int i(0); i < frame_length; ++i) {
        segmental_signal_power += signal[i] * signal[i];

        const double noise(signal_plus_noise[i] - signal[i]);
        segmental_noise_power += noise * noise;
      }
      if (0.0 == segmental_signal_power) {
        std::ostringstream error_message;
        error_message << "The signal power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
      if (0.0 == segmental_noise_power) {
        std::ostringstream error_message;
        error_message << "The noise power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }

      const double segmental_snr_of_current_frame(
          10.0 * std::log10(segmental_signal_power / segmental_noise_power));
      if (OutputType::kSegmentalSnr == output_type) {
        segmental_snr += segmental_snr_of_current_frame;
      } else if (OutputType::kSegmentalSnrPerFrame == output_type) {
        if (!sptk::WriteStream(segmental_snr_of_current_frame, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write segmental SNR of " << frame_index
                        << "th frame";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
      }
    }

    if (OutputType::kSegmentalSnr == output_type && 0 < frame_index) {
      segmental_snr /= frame_index;
      if (!sptk::WriteStream(segmental_snr, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write segmental SNR";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
    }
  }

  return 0;
}